

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::joinTracks(MidiFile *this)

{
  pointer *pppMVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  MidiEventList *pMVar4;
  MidiEvent *event;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  MidiEventList *joinedTrack;
  MidiEventList *local_38;
  
  if (this->m_theTrackState != 1) {
    if (((long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 8) {
      pMVar4 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(pMVar4);
      uVar7 = (uint)((ulong)((long)(this->m_events).
                                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      local_38 = pMVar4;
      if ((int)uVar7 < 1) {
        iVar6 = 0;
      }
      else {
        uVar5 = 0;
        iVar6 = 0;
        do {
          iVar2 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar5]);
          iVar6 = iVar6 + iVar2;
          uVar5 = uVar5 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar5);
      }
      MidiEventList::reserve(local_38,(int)((double)iVar6 * 0.1 + (double)(iVar6 + 0x20)));
      iVar6 = this->m_theTimeState;
      if (iVar6 == 0) {
        makeAbsoluteTicks(this);
      }
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          iVar2 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar5]);
          if (0 < iVar2) {
            iVar2 = 0;
            do {
              pMVar4 = local_38;
              event = MidiEventList::operator[]
                                ((this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5],iVar2);
              MidiEventList::push_back_no_copy(pMVar4,event);
              iVar2 = iVar2 + 1;
              iVar3 = MidiEventList::size((this->m_events).
                                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar5]);
            } while (iVar2 < iVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uVar7 & 0x7fffffff));
      }
      clear_no_deallocate(this);
      pMVar4 = *(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pMVar4 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(pMVar4);
        operator_delete(pMVar4);
      }
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,0);
      __position._M_current =
           (this->m_events).
           super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_events).
          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>>::
        _M_realloc_insert<smf::MidiEventList*const&>
                  ((vector<smf::MidiEventList*,std::allocator<smf::MidiEventList*>> *)this,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppMVar1 = &(this->m_events).
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      sortTracksNoteOnsBeforeOffs(this);
      if (iVar6 == 0) {
        makeDeltaTicks(this);
      }
    }
    this->m_theTrackState = 1;
  }
  return;
}

Assistant:

void MidiFile::joinTracks(void) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		return;
	}
	if (getNumTracks() == 1) {
		m_theTrackState = TRACK_STATE_JOINED;
		return;
	}

	MidiEventList* joinedTrack;
	joinedTrack = new MidiEventList;

	int messagesum = 0;
	int length = getNumTracks();
	int i, j;
	for (i=0; i<length; i++) {
		messagesum += (*m_events[i]).size();
	}
	joinedTrack->reserve((int)(messagesum + 32 + messagesum * 0.1));

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	for (i=0; i<length; i++) {
		for (j=0; j<(int)m_events[i]->size(); j++) {
			joinedTrack->push_back_no_copy(&(*m_events[i])[j]);
		}
	}

	clear_no_deallocate();

	delete m_events[0];
	m_events.resize(0);
	m_events.push_back(joinedTrack);
	sortTracks();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_JOINED;
}